

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanomsg_source.cc
# Opt level: O2

void __thiscall
Nanomsg::start(Nanomsg *this,
              shared_ptr<Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
              *queue)

{
  Nanomsg *local_30;
  thread local_28;
  code *local_20;
  undefined8 local_18;
  
  std::
  __shared_ptr<Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ::operator=((__shared_ptr<Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
               *)((long)&(this->connect).field_2 + 8),
              &queue->
               super___shared_ptr<Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
             );
  local_20 = loop;
  local_18 = 0;
  local_30 = (Nanomsg *)this;
  std::thread::thread<void(Nanomsg::*)(),Nanomsg*,void>(&local_28,(type *)&local_20,&local_30);
  std::thread::operator=((thread *)&(this->connect)._M_string_length,&local_28);
  std::thread::~thread(&local_28);
  pthread_setname_np((this->connect)._M_string_length,"nanomsg");
  return;
}

Assistant:

void Nanomsg::start(const std::shared_ptr<Queue<Samples> >& queue) {
  queue_ = queue;
  thread_ = std::thread(&Nanomsg::loop, this);
#ifdef __APPLE__
  pthread_setname_np("nanomsg");
#else
  pthread_setname_np(thread_.native_handle(), "nanomsg");
#endif
}